

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

value_type __thiscall
gnuplotio::
IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>
::deref(IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>
        *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  runtime_error *this_00;
  reference ppVar4;
  value_type vVar5;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_std::pair<double,_int>_>
  *this_local;
  
  bVar3 = is_end(this);
  if (!bVar3) {
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator*(&this->it);
    uVar1 = ppVar4->first;
    uVar2 = ppVar4->second;
    vVar5.second = uVar2;
    vVar5.first = (double)uVar1;
    vVar5._12_4_ = 0;
    return vVar5;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attepted to dereference past end of iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_type deref() const {
        static_assert(sizeof(TV) && !is_container,
            "deref called on nested container");
        if(is_end()) {
            throw std::runtime_error("attepted to dereference past end of iterator");
        }
        return *it;
    }